

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDelete(LifeTest *this)

{
  uint uVar1;
  int iVar2;
  TestContext *testCtx;
  undefined1 local_30 [4];
  GLuint name;
  ResultCollector errors;
  LifeTest *this_local;
  
  errors.m_message = (char *)this;
  testCtx = tcu::TestNode::getTestContext((TestNode *)this);
  ResultCollector::ResultCollector((ResultCollector *)local_30,testCtx);
  uVar1 = (*this->m_type->_vptr_Type[2])();
  (*this->m_type->_vptr_Type[3])(this->m_type,(ulong)uVar1);
  iVar2 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)uVar1);
  ResultCollector::check
            ((ResultCollector *)local_30,(bool)(~(byte)iVar2 & 1),
             "Object still exists after deletion");
  ResultCollector::~ResultCollector((ResultCollector *)local_30);
  return;
}

Assistant:

void LifeTest::testDelete (void)
{
	ResultCollector	errors	(getTestContext());
	GLuint			name	= m_type.gen();

	m_type.release(name);
	errors.check(!m_type.exists(name), "Object still exists after deletion");
}